

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
::Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
          *table,size_t pos,SiPair *row,uint skip)

{
  size_t *psVar1;
  Impl<1UL,_false> IVar2;
  uint uVar3;
  HashBucket *pHVar4;
  size_t sVar5;
  Impl<0UL,_false> *pIVar6;
  SiPair *pSVar7;
  Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
  *pTVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  HashBucket *pHVar12;
  Impl<1UL,_false> *pIVar13;
  Impl<1UL,_false> *pIVar14;
  Impl<1UL,_false> *extraout_RAX;
  SiPair *pSVar15;
  long lVar16;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_01;
  ulong uVar18;
  ulong targetSize;
  HashBucket *s;
  HashBucket *pHVar19;
  size_t sVar20;
  Maybe<unsigned_long> MVar21;
  NullableValue<unsigned_long> NVar22;
  ArrayPtr<const_unsigned_char> s_00;
  ArrayPtr<const_unsigned_char> s_01;
  bool success;
  byte local_b5;
  uint local_b4;
  Impl<0UL,_false> *local_b0;
  uchar *local_a8;
  SiPair *local_a0;
  size_t local_98;
  size_t local_90;
  Tuple<kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
  *local_88;
  size_t local_80;
  SiPair *local_78;
  Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
  *local_70;
  size_t local_68;
  byte *local_60;
  Tuple<kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
  *local_58;
  Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
  *local_50;
  size_t *local_48;
  SiPair *local_40;
  undefined1 local_38;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar17;
  
  local_90 = pos;
  if (skip == 0) {
    NVar22 = (NullableValue<unsigned_long>)
             Impl<1UL,_false>::insert((Impl<1UL,_false> *)this,table,pos,row,0);
    return (Maybe<unsigned_long>)NVar22;
  }
  local_a0 = (table->rows).builder.ptr;
  lVar16 = (long)(table->rows).builder.pos - (long)local_a0 >> 3;
  local_a8 = (uchar *)(row->str).content.ptr;
  local_98 = (row->str).content.size_;
  uVar18 = (table->indexes).impl.
           super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>.
           value.buckets.size_ * 2;
  local_b4 = skip;
  local_b0 = this;
  local_80 = pos;
  local_78 = row;
  if (uVar18 < ((table->indexes).impl.
                super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
                .value.erasedCount + lVar16 * -0x5555555555555555) * 3 + 3) {
    targetSize = lVar16 * 0x5555555555555556 + 2;
    if (targetSize < uVar18) {
      targetSize = uVar18;
    }
    HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>::rehash
              ((HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *)&table->indexes,
               targetSize);
  }
  local_68 = local_98 - 1;
  s_00.size_ = local_68;
  s_00.ptr = local_a8;
  local_88 = &table->indexes;
  uVar9 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s_00);
  uVar10 = _::chooseBucket(uVar9,(uint)(table->indexes).impl.
                                       super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
                                       .value.buckets.size_);
  pHVar4 = (table->indexes).impl.
           super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>.
           value.buckets.ptr;
  sVar5 = (table->indexes).impl.
          super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>.
          value.buckets.size_;
  pHVar19 = (HashBucket *)0x0;
  pSVar15 = local_a0;
  local_70 = table;
LAB_001452bb:
  pTVar8 = local_70;
  pSVar7 = local_78;
  pIVar6 = local_b0;
  pHVar12 = pHVar4 + uVar10;
  uVar3 = pHVar12->value;
  if (uVar3 == 1) {
    if (pHVar19 == (HashBucket *)0x0) {
      pHVar19 = pHVar12;
    }
  }
  else {
    if (uVar3 == 0) {
      if (pHVar19 != (HashBucket *)0x0) {
        psVar1 = &(local_70->indexes).impl.
                  super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
                  .value.erasedCount;
        *psVar1 = *psVar1 - 1;
        pHVar12 = pHVar19;
      }
      *pHVar12 = (HashBucket)(((ulong)uVar9 | local_80 << 0x20) + 0x200000000);
      local_60 = &local_b5;
      local_b5 = 0;
      local_58 = local_88;
      local_50 = local_70;
      local_48 = &local_90;
      local_40 = local_78;
      local_38 = 0;
      MVar21 = Impl<1UL,_false>::insert
                         ((Impl<1UL,_false> *)local_b0,local_70,local_90,local_78,local_b4);
      aVar17 = MVar21.ptr.field_1;
      IVar2 = *(Impl<1UL,_false> *)pIVar6;
      pIVar13 = (Impl<1UL,_false> *)CONCAT71(MVar21.ptr._1_7_,IVar2);
      local_b5 = (byte)IVar2 ^ 1;
      if (IVar2 != (Impl<1UL,_false>)0x1) goto LAB_0014544d;
      iVar11 = (int)local_90;
      s_01.size_ = (pSVar7->str).content.size_ - 1;
      s_01.ptr = (uchar *)(pSVar7->str).content.ptr;
      uVar9 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s_01);
      uVar9 = _::chooseBucket(uVar9,(uint)(pTVar8->indexes).impl.
                                          super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
                                          .value.buckets.size_);
      pHVar4 = (pTVar8->indexes).impl.
               super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
               .value.buckets.ptr;
      pIVar13 = (Impl<1UL,_false> *)(ulong)uVar9;
      uVar9 = pHVar4[(long)pIVar13].value;
      aVar17 = extraout_RDX_00;
      if (iVar11 + 2U == uVar9) goto LAB_00145410;
      aVar17 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
               (pTVar8->indexes).impl.
               super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
               .value.buckets.size_;
      goto LAB_001453f8;
    }
    if (((pHVar12->hash == uVar9) &&
        (uVar18 = (ulong)(uVar3 - 2), pSVar15[uVar18].str.content.size_ == local_98)) &&
       (iVar11 = bcmp(pSVar15[uVar18].str.content.ptr,local_a8,local_68), pSVar15 = local_a0,
       iVar11 == 0)) goto LAB_0014543a;
  }
  sVar20 = (ulong)uVar10 + 1;
  uVar10 = (uint)sVar20;
  if (sVar20 == sVar5) {
    uVar10 = 0;
  }
  goto LAB_001452bb;
LAB_0014543a:
  *local_b0 = (Impl<0UL,_false>)0x1;
  *(ulong *)(local_b0 + 8) = uVar18;
  pIVar13 = (Impl<1UL,_false> *)local_b0;
  aVar17 = extraout_RDX;
  goto LAB_0014544d;
  while( true ) {
    pIVar14 = pIVar13 + 1;
    pIVar13 = (Impl<1UL,_false> *)((ulong)pIVar14 & 0xffffffff);
    if (pIVar14 == (Impl<1UL,_false> *)aVar17.value) {
      pIVar13 = (Impl<1UL,_false> *)0x0;
    }
    uVar9 = pHVar4[(long)pIVar13].value;
    if (iVar11 + 2U == uVar9) break;
LAB_001453f8:
    if (uVar9 == 0) {
      _::logHashTableInconsistency();
      pIVar13 = extraout_RAX;
      aVar17 = extraout_RDX_01;
      goto LAB_0014544d;
    }
  }
LAB_00145410:
  psVar1 = &(pTVar8->indexes).impl.
            super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
            .value.erasedCount;
  *psVar1 = *psVar1 + 1;
  pHVar4[(long)pIVar13].value = 1;
LAB_0014544d:
  MVar21.ptr.field_1.value = aVar17.value;
  MVar21.ptr._0_8_ = pIVar13;
  return (Maybe<unsigned_long>)MVar21.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_MAYBE(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return *existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == nullptr;
    return result;
  }